

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::NumSamplesCase::NumSamplesCase
          (NumSamplesCase *this,Context *context,char *name,char *description,FboParams *fboParams)

{
  int iVar1;
  FboParams *fboParams_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  NumSamplesCase *this_local;
  
  MultisampleCase::MultisampleCase
            (&this->super_MultisampleCase,context,name,description,0x100,fboParams);
  (this->super_MultisampleCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NumSamplesCase_032989e8;
  this->m_currentIteration = 0;
  iVar1 = getIterationCount((this->super_MultisampleCase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx,0x10);
  this->m_maxNumIterations = iVar1;
  std::vector<tcu::RGBA,_std::allocator<tcu::RGBA>_>::vector(&this->m_detectedColors);
  return;
}

Assistant:

NumSamplesCase::NumSamplesCase (Context& context, const char* name, const char* description, const FboParams& fboParams)
	: MultisampleCase		(context, name, description, 256, fboParams)
	, m_currentIteration	(0)
	, m_maxNumIterations	(getIterationCount(m_testCtx, DEFAULT_MAX_NUM_ITERATIONS))
{
}